

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

void __thiscall slang::SVInt::setAllX(SVInt *this)

{
  uint uVar1;
  uint uVar2;
  uint64_t *puVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar2 = (this->super_SVIntStorage).bitWidth;
  uVar1 = uVar2 + 0x3f;
  uVar4 = uVar1 >> 6;
  uVar5 = (ulong)uVar4;
  if ((this->super_SVIntStorage).unknownFlag == true) {
    memset((this->super_SVIntStorage).field_0.pVal,0,(ulong)(uVar4 * 8));
  }
  else {
    if ((0x40 < uVar2) &&
       (puVar3 = (this->super_SVIntStorage).field_0.pVal, puVar3 != (uint64_t *)0x0)) {
      operator_delete__(puVar3);
    }
    (this->super_SVIntStorage).unknownFlag = true;
    puVar3 = (uint64_t *)operator_new__((ulong)(uVar4 << 4));
    memset(puVar3,0,(ulong)(uVar4 << 4));
    (this->super_SVIntStorage).field_0.pVal = puVar3;
  }
  if (0x3f < uVar1) {
    do {
      (this->super_SVIntStorage).field_0.pVal[uVar5] = 0xffffffffffffffff;
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4 * 2);
  }
  clearUnusedBits(this);
  return;
}

Assistant:

void SVInt::setAllX() {
    // first set low half to zero (for X)
    uint32_t words = getNumWords(bitWidth, false);
    if (unknownFlag)
        memset(pVal, 0, words * WORD_SIZE);
    else {
        if (!isSingleWord())
            delete[] pVal;

        unknownFlag = true;
        pVal = new uint64_t[words * 2]();
    }

    // now set upper half to ones (for unknown)
    for (uint32_t i = words; i < words * 2; i++)
        pVal[i] = UINT64_MAX;
    clearUnusedBits();
}